

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::ItoRFunction::checkArguments
          (ItoRFunction *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,1);
  if (bVar2) {
    bVar2 = Type::isNumeric(((*args->_M_ptr)->type).ptr);
    if (!bVar2) {
      pTVar3 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*args->_M_ptr);
      return pTVar3;
    }
    pTVar3 = pCVar1->realType;
  }
  else {
    pTVar3 = pCVar1->errorType;
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        if (!args[0]->type->isNumeric())
            return badArg(context, *args[0]);

        return comp.getRealType();
    }